

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O0

int bsc_xfer(int pi,bsc_xfer_t *bscxfer)

{
  uint32_t uVar1;
  int iVar2;
  gpioExtent_t *in_RSI;
  gpioExtent_t ext [1];
  int status;
  int bytes;
  int in_stack_00000fc0;
  int in_stack_00000fc4;
  void *in_stack_00000fc8;
  int in_stack_00000fd4;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  int in_stack_ffffffffffffffe0;
  uint32_t local_18;
  int in_stack_fffffffffffffff8;
  
  uVar1 = pigpio_command_ext(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,
                             in_stack_ffffffffffffffd8,
                             (int)((ulong)&in_RSI[0x15].field_0x14 >> 0x20),
                             (int)&in_RSI[0x15].field_0x14,(int)in_RSI[0x15].data >> 0x1f,in_RSI,
                             in_stack_fffffffffffffff8);
  if (0 < (int)uVar1) {
    recvMax(in_stack_00000fd4,in_stack_00000fc8,in_stack_00000fc4,in_stack_00000fc0);
    uVar1 = ntohl(local_18);
    iVar2 = recvMax(in_stack_00000fd4,in_stack_00000fc8,in_stack_00000fc4,in_stack_00000fc0);
    *(int *)((long)&in_RSI->size + 4) = iVar2;
  }
  local_18 = uVar1;
  _pmu(0);
  return local_18;
}

Assistant:

int bsc_xfer(int pi, bsc_xfer_t *bscxfer)
{
   int bytes;
   int status;
   gpioExtent_t ext[1];

   /*
   p1=control
   p2=0
   p3=len
   ## extension ##
   char buf[len]
   */

   ext[0].size = bscxfer->txCnt;
   ext[0].ptr = bscxfer->txBuf;

   bytes = pigpio_command_ext
      (pi, PI_CMD_BSCX, bscxfer->control, 0, bscxfer->txCnt, 1, ext, 0);

   if (bytes > 0)
   {
      recvMax(pi, &status, 4, 4);
      status = ntohl(status);
      bytes -= 4;
      bytes = recvMax(pi, bscxfer->rxBuf, sizeof(bscxfer->rxBuf), bytes);
      bscxfer->rxCnt = bytes;
   }
   else
   {
      status = bytes;
   }

   _pmu(pi);

   return status;
}